

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O3

Matrix * TRM::lookAt(Matrix *__return_storage_ptr__,Vec3f eye,Vec3f center,Vec3f up)

{
  ulong uVar1;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar2;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar3;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  aVar4 = eye.field_2;
  fVar7 = center.field_2.z - aVar4.z;
  aVar2 = eye.field_0;
  fVar5 = center.field_0.x - aVar2.x;
  aVar3 = eye.field_1;
  fVar6 = center.field_1.y - aVar3.y;
  fVar9 = 1.0 / SQRT(fVar6 * fVar6 + fVar5 * fVar5 + fVar7 * fVar7);
  fVar7 = fVar7 * fVar9;
  fVar5 = fVar9 * fVar5;
  fVar9 = fVar9 * fVar6;
  fVar11 = fVar7 * up.field_0.x - fVar5 * up.field_2.z;
  fVar6 = up.field_1.y * fVar5 - fVar9 * up.field_0.x;
  fVar8 = up.field_2.z * fVar9 - fVar7 * up.field_1.y;
  fVar10 = 1.0 / SQRT(fVar8 * fVar8 + fVar11 * fVar11 + fVar6 * fVar6);
  fVar8 = fVar8 * fVar10;
  fVar11 = fVar11 * fVar10;
  fVar10 = fVar10 * fVar6;
  fVar12 = fVar11 * fVar7 - fVar10 * fVar9;
  fVar13 = fVar10 * fVar5 - fVar8 * fVar7;
  *(undefined8 *)&__return_storage_ptr__->value[0].field_3 = 0;
  __return_storage_ptr__->value[1].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  __return_storage_ptr__->value[1].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  *(undefined8 *)&__return_storage_ptr__->value[1].field_3 = 0;
  __return_storage_ptr__->value[2].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  __return_storage_ptr__->value[2].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  __return_storage_ptr__->value[2].field_3.w = 0.0;
  __return_storage_ptr__->value[3].field_3.w = 1.0;
  __return_storage_ptr__->value[0].field_0.x = fVar8;
  __return_storage_ptr__->value[1].field_0.x = fVar11;
  __return_storage_ptr__->value[2].field_0.x = fVar10;
  __return_storage_ptr__->value[0].field_1.y = fVar12;
  fVar6 = fVar9 * fVar8 - fVar11 * fVar5;
  __return_storage_ptr__->value[1].field_1.y = fVar13;
  __return_storage_ptr__->value[2].field_1.y = fVar6;
  __return_storage_ptr__->value[0].field_2.z = -fVar5;
  __return_storage_ptr__->value[1].field_2.z = -fVar9;
  __return_storage_ptr__->value[2].field_2.z = -fVar7;
  uVar1 = CONCAT44(aVar4.z * fVar6 + fVar13 * aVar3.y + aVar2.x * fVar12,
                   aVar4.z * fVar10 + fVar8 * aVar2.x + aVar3.y * fVar11) ^ 0x8000000080000000;
  __return_storage_ptr__->value[3].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar1;
  __return_storage_ptr__->value[3].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)(int)(uVar1 >> 0x20);
  __return_storage_ptr__->value[3].field_2.z = fVar9 * aVar3.y + fVar5 * aVar2.x + fVar7 * aVar4.z;
  return __return_storage_ptr__;
}

Assistant:

Matrix lookAt(Vec3f eye, Vec3f center, Vec3f up) {
  return glm::lookAt(eye, center, up);
}